

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O2

ListenerNode * __thiscall Selector::findListener(Selector *this,int fd,SelectorListener *listener)

{
  bool bVar1;
  Node *pNVar2;
  ListenerNode n;
  ListenerNode local_38;
  
  pNVar2 = (this->mList).mHead;
  local_38.mFd = fd;
  local_38.mListener = listener;
  do {
    pNVar2 = pNVar2->next;
    if (pNVar2 == (this->mList).mTail) {
      return (ListenerNode *)0x0;
    }
    bVar1 = ListenerNode::operator==(pNVar2->val,&local_38);
  } while (!bVar1);
  return pNVar2->val;
}

Assistant:

Selector::ListenerNode *Selector::findListener( int fd, SelectorListener *listener )
{
	ListenerNode n( fd, listener );
	for (JetHead::list<ListenerNode*>::iterator i = mList.begin(); 
		 i != mList.end(); ++i)
	{
		if (*(*i) == n)
		{
			return *i;
		}
	}
		
	return NULL;
}